

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_done(uv__work *w,int status)

{
  undefined8 in_RAX;
  uint uVar1;
  undefined4 in_register_00000034;
  
  uVar1 = ((w[-7].loop)->active_reqs).count;
  if (uVar1 == 0) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/fs.c"
                  ,0x55d,"void uv__fs_done(struct uv__work *, int)");
  }
  uVar1 = uVar1 - 1;
  ((w[-7].loop)->active_reqs).count = uVar1;
  if (status == -0x7d) {
    if (w[-7].wq[1] != (void *)0x0) {
      __assert_fail("req->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/fs.c"
                    ,0x560,"void uv__fs_done(struct uv__work *, int)");
    }
    w[-7].wq[1] = (void *)0xffffffffffffff83;
  }
  (*(code *)w[-7].wq[0])(w[-9].wq,CONCAT44(in_register_00000034,status),uVar1,in_RAX);
  return;
}

Assistant:

static void uv__fs_done(struct uv__work* w, int status) {
  uv_fs_t* req;

  req = container_of(w, uv_fs_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == UV_ECANCELED) {
    assert(req->result == 0);
    req->result = UV_ECANCELED;
  }

  req->cb(req);
}